

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void show_obj(wchar_t obj_num,wchar_t row,wchar_t col,_Bool cursor,olist_detail_t mode)

{
  object_menu_data *__s;
  byte bVar1;
  object *obj;
  loc grid;
  short sVar2;
  _Bool _Var3;
  int16_t iVar4;
  uint uVar5;
  wchar_t wVar6;
  int iVar7;
  size_t sVar8;
  class_book *pcVar9;
  store_conflict *store;
  uint uVar10;
  ulong uVar11;
  uint8_t uVar12;
  wchar_t row_00;
  char *__s_00;
  wchar_t wVar13;
  char buf [80];
  int local_98;
  char local_88 [88];
  
  __s = items + obj_num;
  obj = items[obj_num].object;
  if ((mode & (OLIST_DEATH|OLIST_WINDOW)) == OLIST_NONE) {
    iVar7 = 0;
  }
  else {
    sVar8 = strlen(__s->label);
    iVar7 = (int)sVar8;
  }
  sVar8 = strlen(items[obj_num].equip_label);
  row_00 = row + obj_num;
  wVar13 = L'\x01';
  if (L'\x01' < col) {
    wVar13 = col;
  }
  prt("",row_00,wVar13 + L'\xffffffff');
  if (__s->label[0] != '\0') {
    uVar12 = '\x01';
    if (cursor) {
      uVar12 = '\x0e';
    }
    if ((mode & (OLIST_DEATH|OLIST_WINDOW)) != OLIST_NONE) {
      c_put_str(uVar12,__s->label,row_00,col);
    }
    wVar13 = col + iVar7;
    c_put_str(uVar12,items[obj_num].equip_label,row_00,wVar13);
    local_98 = (int)sVar8;
    __s_00 = items[obj_num].o_name;
    sVar8 = strlen(__s_00);
    if ((ulong)(long)ex_offset < sVar8 + (long)(iVar7 + local_98)) {
      uVar10 = ex_offset - (iVar7 + local_98);
      uVar5 = 0;
      if (0 < (int)uVar10) {
        uVar5 = uVar10;
      }
      uVar11 = 0x4f;
      if ((int)uVar5 < 0x4f) {
        uVar11 = (ulong)uVar5;
      }
      __s_00[uVar11] = '\0';
    }
    if (obj == (object *)0x0) {
      c_put_str('\x02',__s_00,row_00,wVar13 + local_98);
      return;
    }
    uVar12 = (uint8_t)obj->kind->base->attr;
    _Var3 = tval_is_book_k(obj->kind);
    if ((_Var3) && (pcVar9 = player_object_to_book(player,obj), pcVar9 == (class_book *)0x0)) {
      uVar12 = '\x02';
    }
    c_put_str(uVar12,__s_00,row_00,wVar13 + local_98);
    wVar13 = ex_offset;
    if (((mode & OLIST_PRICE) != OLIST_NONE) &&
       (grid.x = (player->grid).x, grid.y = (player->grid).y, store = store_at((chunk *)cave,grid),
       store != (store_conflict *)0x0)) {
      wVar6 = price_item(store,obj,true,(uint)obj->number);
      strnfmt(local_88,0x50,"%6d au",(ulong)(uint)wVar6);
      put_str(local_88,row_00,wVar13 + col);
      wVar13 = wVar13 + L'\t';
    }
    if (((mode & OLIST_FAIL) != OLIST_NONE) && (_Var3 = obj_can_fail(obj), _Var3)) {
      wVar6 = get_use_device_chance(obj);
      _Var3 = object_effect_is_known(obj);
      if (_Var3) {
        strnfmt(local_88,0x50,"%4d%% fail",(ulong)(uint)((wVar6 + L'\t') / 10));
      }
      else {
        my_strcpy(local_88,"    ? fail",0x50);
      }
      put_str(local_88,row_00,wVar13 + col);
      wVar13 = wVar13 + L'\n';
    }
    if ((mode >> 8 & 1) != 0) {
      wVar6 = recharge_failure_chance(obj,player->upkeep->recharge_pow);
      _Var3 = object_effect_is_known(obj);
      if (_Var3) {
        sVar2 = (short)(1000 / (long)wVar6);
        uVar5 = (int)sVar2 / 10;
        strnfmt(local_88,0x50,"%2d.%1d%% fail",(ulong)uVar5,
                (ulong)(uint)(int)(short)(sVar2 + (short)uVar5 * -10));
      }
      else {
        my_strcpy(local_88,"    ? fail",0x50);
      }
      put_str(local_88,row_00,wVar13 + col);
      wVar13 = wVar13 + L'\n';
    }
    if ((mode & OLIST_WEIGHT) != OLIST_NONE) {
      bVar1 = obj->number;
      iVar4 = object_weight_one(obj);
      iVar7 = (int)iVar4 * (uint)bVar1;
      strnfmt(local_88,0x50,"%4d.%1d lb",(ulong)(uint)(iVar7 / 10),(ulong)(uint)(iVar7 % 10));
      put_str(local_88,row_00,wVar13 + col);
    }
  }
  return;
}

Assistant:

static void show_obj(int obj_num, int row, int col, bool cursor,
					 olist_detail_t mode)
{
	int attr;
	int label_attr = cursor ? COLOUR_L_BLUE : COLOUR_WHITE;
	int ex_offset_ctr;
	char buf[80];
	struct object *obj = items[obj_num].object;
	bool show_label = mode & (OLIST_WINDOW | OLIST_DEATH) ? true : false;
	int label_size = show_label ? strlen(items[obj_num].label) : 0;
	int equip_label_size = strlen(items[obj_num].equip_label);

	/* Clear the line */
	prt("", row + obj_num, MAX(col - 1, 0));

	/* If we have no label then we won't display anything */
	if (!strlen(items[obj_num].label)) return;

	/* Print the label */
	if (show_label)
		c_put_str(label_attr, items[obj_num].label, row + obj_num, col);

	/* Print the equipment label */
	c_put_str(label_attr, items[obj_num].equip_label, row + obj_num,
			  col + label_size);

	/* Limit object name */
	if (label_size + equip_label_size + strlen(items[obj_num].o_name) >
		(size_t)ex_offset) {
		int truncate = ex_offset - label_size - equip_label_size;

		if (truncate < 0) truncate = 0;
		if ((size_t)truncate > sizeof(items[obj_num].o_name) - 1)
			truncate = sizeof(items[obj_num].o_name) - 1;

		items[obj_num].o_name[truncate] = '\0';
	}

	/* Item kind determines the color of the output */
	if (obj) {
		attr = obj->kind->base->attr;

		/* Unreadable books are a special case */
		if (tval_is_book_k(obj->kind) &&
			(player_object_to_book(player, obj) == NULL)) {
			attr = COLOUR_SLATE;
		}
	} else {
		attr = COLOUR_SLATE;
	}

	/* Object name */
	c_put_str(attr, items[obj_num].o_name, row + obj_num,
			  col + label_size + equip_label_size);

	/* If we don't have an object, we can skip the rest of the output */
	if (!obj) return;

	/* Extra fields */
	ex_offset_ctr = ex_offset;

	/* Price */
	if (mode & OLIST_PRICE) {
		struct store *store = store_at(cave, player->grid);
		if (store) {
			int price = price_item(store, obj, true, obj->number);

			strnfmt(buf, sizeof(buf), "%6d au", price);
			put_str(buf, row + obj_num, col + ex_offset_ctr);
			ex_offset_ctr += 9;
		}
	}

	/* Failure chance for magic devices and activations */
	if (mode & OLIST_FAIL && obj_can_fail(obj)) {
		int fail = (9 + get_use_device_chance(obj)) / 10;
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%4d%% fail", fail);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Failure chances for recharging an item; see effect_handler_RECHARGE */
	if (mode & OLIST_RECHARGE) {
		int fail = 1000 / recharge_failure_chance(obj, player->upkeep->recharge_pow);
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%2d.%1d%% fail", fail / 10, fail % 10);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Weight */
	if (mode & OLIST_WEIGHT) {
		int weight = obj->number * object_weight_one(obj);
		strnfmt(buf, sizeof(buf), "%4d.%1d lb", weight / 10, weight % 10);
		put_str(buf, row + obj_num, col + ex_offset_ctr);
	}
}